

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parseRawArea(FfsParser *this,UModelIndex *index)

{
  bool bVar1;
  UINT8 UVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  UINT32 UVar6;
  uint uVar7;
  uint uVar8;
  int32_t iVar9;
  uint32_t uVar10;
  int32_t iVar11;
  uint uVar12;
  uint32_t uVar13;
  int iVar14;
  int iVar15;
  USTATUS UVar16;
  char *pcVar17;
  UINT8 *buffer;
  fdm_board_ids_t *pfVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference puVar19;
  fdm_entries_t *this_01;
  vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>
  *this_02;
  pointer pfVar20;
  EFI_GUID_ *v;
  long lVar21;
  uint64_t uVar22;
  TreeModel *pTVar23;
  ulong uVar24;
  EFI_GUID_ EVar25;
  undefined1 local_e68 [8];
  UModelIndex current;
  int i_2;
  UByteArray local_e30;
  UByteArray local_e10;
  CBString local_df0;
  CBString local_dd8;
  CBString local_dc0;
  undefined1 local_da8 [8];
  UByteArray padding_3;
  UByteArray local_d70;
  UByteArray local_d50;
  CBString local_d30;
  CBString local_d18;
  CBString local_d00;
  CBString local_ce8;
  undefined1 local_cd0 [8];
  PROTECTED_RANGE range;
  CBString local_c88;
  string local_c70;
  CBString local_c50;
  byte local_c31;
  undefined1 local_c30 [7];
  UINT8 i_1;
  CBString local_c18;
  CBString local_c00;
  CBString local_be8;
  CBString local_bd0;
  uint local_bb4;
  undefined1 local_bb0 [4];
  UINT32 entrySize;
  UByteArray local_b90;
  undefined1 local_b70 [8];
  CBString text;
  string local_b40;
  undefined1 local_b20 [8];
  EFI_GUID guid;
  unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_> *entry;
  iterator __end6;
  iterator __begin6;
  vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>
  *__range6;
  undefined1 local_ae8 [3];
  bool protectedRangeFound;
  UINT32 entryOffset;
  CBString local_ac8;
  undefined1 local_ab0 [8];
  UModelIndex headerIndex;
  unsigned_long *boardId;
  iterator __end7;
  iterator __begin7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range7;
  undefined1 local_a58 [4];
  UINT32 i;
  CBString local_a40;
  CBString local_a28;
  byte local_a09;
  UINT8 *pUStack_a08;
  UINT8 calculated;
  INSYDE_FLASH_DEVICE_MAP_HEADER *tempFdmHeader;
  UByteArray tempHeader;
  CBString info_1;
  CBString name_1;
  UByteArray body;
  UByteArray header;
  undefined1 local_968 [4];
  UINT32 storeSize;
  insyde_fdm_t parsed;
  kstream ks;
  umemstream is;
  UByteArray fdm;
  CBString local_580;
  CBString local_568;
  undefined1 local_550 [8];
  UModelIndex bpdtPtIndex;
  UByteArray local_518;
  CBString local_4f8;
  undefined1 local_4e0 [8];
  UModelIndex bpdtIndex;
  CBString local_4b0;
  undefined1 local_498 [8];
  UByteArray bpdtStore;
  CBString local_460;
  CBString local_448;
  undefined1 local_430 [8];
  UByteArray microcode;
  UModelIndex microcodeIndex;
  CBString local_3e0;
  CBString local_3c8;
  CBString local_3b0;
  undefined1 local_398 [8];
  UByteArray volume;
  UModelIndex volumeIndex;
  UByteArray local_348;
  UByteArray local_328;
  CBString local_308;
  undefined1 local_2f0 [8];
  UModelIndex paddingIndex;
  CBString local_2c0;
  undefined1 local_2a8 [8];
  UByteArray padding_2;
  UByteArray local_270;
  UByteArray local_250;
  CBString local_230;
  CBString local_218;
  CBString local_200;
  undefined1 local_1e8 [8];
  UByteArray padding_1;
  UINT32 paddingSize;
  UINT32 paddingOffset;
  UINT32 itemAltSize;
  UINT32 itemSize;
  UINT32 itemOffset;
  UINT8 itemType;
  UByteArray local_198;
  UByteArray local_178;
  CBString local_158;
  CBString local_140;
  CBString local_128;
  undefined1 local_110 [8];
  UByteArray padding;
  UINT32 local_e8;
  UINT32 local_e4;
  UINT32 prevItemAltSize;
  UINT32 prevItemSize;
  UINT32 prevItemOffset;
  UINT8 prevItemType;
  CBString info;
  CBString name;
  USTATUS result;
  UByteArray local_90;
  UINT32 local_6c;
  undefined1 local_68 [4];
  UINT32 headerSize;
  UByteArray data;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  data.d.field_2._8_8_ = index;
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    TreeModel::body((UByteArray *)local_68,this->model,(UModelIndex *)data.d.field_2._8_8_);
    TreeModel::header(&local_90,this->model,(UModelIndex *)data.d.field_2._8_8_);
    UVar6 = UByteArray::size(&local_90);
    UByteArray::~UByteArray(&local_90);
    local_6c = UVar6;
    Bstrlib::CBString::CBString((CBString *)&info.super_tagbstring.data);
    Bstrlib::CBString::CBString((CBString *)&prevItemOffset);
    prevItemSize._3_1_ = '\0';
    prevItemAltSize = 0;
    local_e4 = 0;
    local_e8 = 0;
    UVar16 = findNextRawAreaItem(this,(UModelIndex *)data.d.field_2._8_8_,0,
                                 (UINT8 *)((long)&prevItemSize + 3),&prevItemAltSize,&local_e4,
                                 &local_e8);
    if (UVar16 == 0) {
      UVar2 = TreeModel::type(this->model,(UModelIndex *)data.d.field_2._8_8_);
      if ((UVar2 == '?') &&
         (UVar2 = TreeModel::subtype(this->model,(UModelIndex *)data.d.field_2._8_8_),
         UVar2 == '\x01')) {
        UVar6 = TreeModel::base(this->model,(UModelIndex *)data.d.field_2._8_8_);
        this->protectedRegionsBase = (ulong)UVar6 + (ulong)prevItemAltSize;
      }
      if (prevItemAltSize != 0) {
        UByteArray::left((UByteArray *)local_110,(UByteArray *)local_68,prevItemAltSize);
        Bstrlib::CBString::CBString(&local_128,"Padding");
        Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_128);
        Bstrlib::CBString::~CBString(&local_128);
        uVar7 = UByteArray::size((UByteArray *)local_110);
        uVar8 = UByteArray::size((UByteArray *)local_110);
        usprintf(&local_140,"Full size: %Xh (%u)",(ulong)uVar7,(ulong)uVar8);
        Bstrlib::CBString::operator=((CBString *)&prevItemOffset,&local_140);
        Bstrlib::CBString::~CBString(&local_140);
        UVar6 = local_6c;
        pTVar23 = this->model;
        UVar2 = getPaddingType((UByteArray *)local_110);
        Bstrlib::CBString::CBString(&local_158);
        UByteArray::UByteArray(&local_178);
        UByteArray::UByteArray(&local_198);
        TreeModel::addItem((UModelIndex *)&itemOffset,pTVar23,UVar6,'@',UVar2,
                           (CBString *)&info.super_tagbstring.data,&local_158,
                           (CBString *)&prevItemOffset,&local_178,(UByteArray *)local_110,&local_198
                           ,Fixed,(UModelIndex *)data.d.field_2._8_8_,'\0');
        UByteArray::~UByteArray(&local_198);
        UByteArray::~UByteArray(&local_178);
        Bstrlib::CBString::~CBString(&local_158);
        UByteArray::~UByteArray((UByteArray *)local_110);
      }
      itemSize._3_1_ = prevItemSize._3_1_;
      itemAltSize = prevItemAltSize;
      paddingOffset = local_e4;
      paddingSize = local_e8;
      name.super_tagbstring.data = (uchar *)0x0;
      while (name.super_tagbstring.data == (uchar *)0x0) {
        if (prevItemAltSize + local_e4 < itemAltSize) {
          padding_1.d.field_2._12_4_ = prevItemAltSize + local_e4;
          padding_1.d.field_2._8_4_ = itemAltSize - padding_1.d.field_2._12_4_;
          UByteArray::mid((UByteArray *)local_1e8,(UByteArray *)local_68,padding_1.d.field_2._12_4_,
                          padding_1.d.field_2._8_4_);
          Bstrlib::CBString::CBString(&local_200,"Padding");
          Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_200);
          Bstrlib::CBString::~CBString(&local_200);
          uVar7 = UByteArray::size((UByteArray *)local_1e8);
          uVar8 = UByteArray::size((UByteArray *)local_1e8);
          usprintf(&local_218,"Full size: %Xh (%u)",(ulong)uVar7,(ulong)uVar8);
          Bstrlib::CBString::operator=((CBString *)&prevItemOffset,&local_218);
          Bstrlib::CBString::~CBString(&local_218);
          pTVar23 = this->model;
          UVar6 = local_6c + padding_1.d.field_2._12_4_;
          UVar2 = getPaddingType((UByteArray *)local_1e8);
          Bstrlib::CBString::CBString(&local_230);
          UByteArray::UByteArray(&local_250);
          UByteArray::UByteArray(&local_270);
          TreeModel::addItem((UModelIndex *)((long)&padding_2.d.field_2 + 8),pTVar23,UVar6,'@',UVar2
                             ,(CBString *)&info.super_tagbstring.data,&local_230,
                             (CBString *)&prevItemOffset,&local_250,(UByteArray *)local_1e8,
                             &local_270,Fixed,(UModelIndex *)data.d.field_2._8_8_,'\0');
          UByteArray::~UByteArray(&local_270);
          UByteArray::~UByteArray(&local_250);
          Bstrlib::CBString::~CBString(&local_230);
          UByteArray::~UByteArray((UByteArray *)local_1e8);
        }
        UVar6 = paddingOffset;
        uVar7 = UByteArray::size((UByteArray *)local_68);
        if ((uVar7 < UVar6) ||
           (uVar7 = itemAltSize + paddingOffset, uVar8 = UByteArray::size((UByteArray *)local_68),
           uVar8 < uVar7)) {
          UByteArray::mid((UByteArray *)local_2a8,(UByteArray *)local_68,itemAltSize,-1);
          Bstrlib::CBString::CBString(&local_2c0,"Padding");
          Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_2c0);
          Bstrlib::CBString::~CBString(&local_2c0);
          uVar7 = UByteArray::size((UByteArray *)local_2a8);
          uVar8 = UByteArray::size((UByteArray *)local_2a8);
          usprintf((CBString *)&paddingIndex.m,"Full size: %Xh (%u)",(ulong)uVar7,(ulong)uVar8);
          Bstrlib::CBString::operator=((CBString *)&prevItemOffset,(CBString *)&paddingIndex.m);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex.m);
          pTVar23 = this->model;
          UVar6 = local_6c + itemAltSize;
          UVar2 = getPaddingType((UByteArray *)local_2a8);
          Bstrlib::CBString::CBString(&local_308);
          UByteArray::UByteArray(&local_328);
          UByteArray::UByteArray(&local_348);
          TreeModel::addItem((UModelIndex *)local_2f0,pTVar23,UVar6,'@',UVar2,
                             (CBString *)&info.super_tagbstring.data,&local_308,
                             (CBString *)&prevItemOffset,&local_328,(UByteArray *)local_2a8,
                             &local_348,Fixed,(UModelIndex *)data.d.field_2._8_8_,'\0');
          UByteArray::~UByteArray(&local_348);
          UByteArray::~UByteArray(&local_328);
          Bstrlib::CBString::~CBString(&local_308);
          usprintf((CBString *)&volumeIndex.m,"%s: one of objects inside overlaps the end of data",
                   "parseRawArea");
          msg(this,(CBString *)&volumeIndex.m,(UModelIndex *)local_2f0);
          Bstrlib::CBString::~CBString((CBString *)&volumeIndex.m);
          prevItemAltSize = itemAltSize;
          local_e4 = UByteArray::size((UByteArray *)local_2a8);
          padding.d.field_2._12_4_ = 3;
          UByteArray::~UByteArray((UByteArray *)local_2a8);
          break;
        }
        if (itemSize._3_1_ == 'A') {
          UModelIndex::UModelIndex((UModelIndex *)((long)&volume.d.field_2 + 8));
          UByteArray::mid((UByteArray *)local_398,(UByteArray *)local_68,itemAltSize,paddingOffset);
          UVar16 = parseVolumeHeader(this,(UByteArray *)local_398,local_6c + itemAltSize,
                                     (UModelIndex *)data.d.field_2._8_8_,
                                     (UModelIndex *)((long)&volume.d.field_2 + 8));
          if (UVar16 == 0) {
            if (paddingOffset != paddingSize) {
              usprintf((CBString *)&microcodeIndex.m,
                       "%s: volume size stored in header %Xh differs from calculated using block map %Xh"
                       ,"parseRawArea",(ulong)paddingOffset,(ulong)paddingSize);
              msg(this,(CBString *)&microcodeIndex.m,(UModelIndex *)((long)&volume.d.field_2 + 8));
              Bstrlib::CBString::~CBString((CBString *)&microcodeIndex.m);
            }
          }
          else {
            usprintf(&local_3c8,"%s: volume header parsing failed with error ","parseRawArea");
            errorCodeToUString(&local_3e0,UVar16);
            Bstrlib::CBString::operator+(&local_3b0,&local_3c8,&local_3e0);
            msg(this,&local_3b0,(UModelIndex *)data.d.field_2._8_8_);
            Bstrlib::CBString::~CBString(&local_3b0);
            Bstrlib::CBString::~CBString(&local_3e0);
            Bstrlib::CBString::~CBString(&local_3c8);
          }
          UByteArray::~UByteArray((UByteArray *)local_398);
        }
        else if (itemSize._3_1_ == 'U') {
          UModelIndex::UModelIndex((UModelIndex *)((long)&microcode.d.field_2 + 8));
          UByteArray::mid((UByteArray *)local_430,(UByteArray *)local_68,itemAltSize,paddingOffset);
          UVar16 = parseIntelMicrocodeHeader
                             (this,(UByteArray *)local_430,local_6c + itemAltSize,
                              (UModelIndex *)data.d.field_2._8_8_,
                              (UModelIndex *)((long)&microcode.d.field_2 + 8));
          if (UVar16 != 0) {
            usprintf(&local_460,"%s: microcode header parsing failed with error ","parseRawArea");
            errorCodeToUString((CBString *)((long)&bpdtStore.d.field_2 + 8),UVar16);
            Bstrlib::CBString::operator+
                      (&local_448,&local_460,(CBString *)((long)&bpdtStore.d.field_2 + 8));
            msg(this,&local_448,(UModelIndex *)data.d.field_2._8_8_);
            Bstrlib::CBString::~CBString(&local_448);
            Bstrlib::CBString::~CBString((CBString *)((long)&bpdtStore.d.field_2 + 8));
            Bstrlib::CBString::~CBString(&local_460);
          }
          UByteArray::~UByteArray((UByteArray *)local_430);
        }
        else if (itemSize._3_1_ == '\\') {
          UByteArray::mid((UByteArray *)local_498,(UByteArray *)local_68,itemAltSize,paddingOffset);
          Bstrlib::CBString::CBString(&local_4b0,"BPDT region");
          Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_4b0);
          Bstrlib::CBString::~CBString(&local_4b0);
          uVar7 = UByteArray::size((UByteArray *)local_498);
          uVar8 = UByteArray::size((UByteArray *)local_498);
          usprintf((CBString *)&bpdtIndex.m,"Full size: %Xh (%u)",(ulong)uVar7,(ulong)uVar8);
          Bstrlib::CBString::operator=((CBString *)&prevItemOffset,(CBString *)&bpdtIndex.m);
          Bstrlib::CBString::~CBString((CBString *)&bpdtIndex.m);
          pTVar23 = this->model;
          UVar6 = local_6c + itemAltSize;
          Bstrlib::CBString::CBString(&local_4f8);
          UByteArray::UByteArray(&local_518);
          UByteArray::UByteArray((UByteArray *)&bpdtPtIndex.m);
          TreeModel::addItem((UModelIndex *)local_4e0,pTVar23,UVar6,'\\','\0',
                             (CBString *)&info.super_tagbstring.data,&local_4f8,
                             (CBString *)&prevItemOffset,&local_518,(UByteArray *)local_498,
                             (UByteArray *)&bpdtPtIndex.m,Fixed,(UModelIndex *)data.d.field_2._8_8_,
                             '\0');
          UByteArray::~UByteArray((UByteArray *)&bpdtPtIndex.m);
          UByteArray::~UByteArray(&local_518);
          Bstrlib::CBString::~CBString(&local_4f8);
          UModelIndex::UModelIndex((UModelIndex *)local_550);
          UVar16 = parseBpdtRegion(this,(UByteArray *)local_498,0,0,(UModelIndex *)local_4e0,
                                   (UModelIndex *)local_550);
          if (UVar16 != 0) {
            usprintf(&local_580,"%s: BPDT store parsing failed with error ","parseRawArea");
            errorCodeToUString((CBString *)((long)&fdm.d.field_2 + 8),UVar16);
            Bstrlib::CBString::operator+
                      (&local_568,&local_580,(CBString *)((long)&fdm.d.field_2 + 8));
            msg(this,&local_568,(UModelIndex *)data.d.field_2._8_8_);
            Bstrlib::CBString::~CBString(&local_568);
            Bstrlib::CBString::~CBString((CBString *)((long)&fdm.d.field_2 + 8));
            Bstrlib::CBString::~CBString(&local_580);
          }
          UByteArray::~UByteArray((UByteArray *)local_498);
        }
        else {
          if (itemSize._3_1_ != 'L') {
            this_local = (FfsParser *)0x9;
            goto LAB_00148dc4;
          }
          UByteArray::mid((UByteArray *)&is.field_0x150,(UByteArray *)local_68,itemAltSize,
                          paddingOffset);
          pcVar17 = UByteArray::constData((UByteArray *)&is.field_0x150);
          iVar9 = UByteArray::size((UByteArray *)&is.field_0x150);
          umemstream::umemstream((umemstream *)&ks.m_bits,pcVar17,(long)iVar9);
          kaitai::kstream::kstream((kstream *)&parsed.m__io__raw_entries,(istream *)&ks.m_bits);
          insyde_fdm_t::insyde_fdm_t
                    ((insyde_fdm_t *)local_968,(kstream *)&parsed.m__io__raw_entries,(kstruct *)0x0,
                     (insyde_fdm_t *)0x0);
          uVar7 = UByteArray::size((UByteArray *)&is.field_0x150);
          uVar10 = insyde_fdm_t::data_offset((insyde_fdm_t *)local_968);
          UByteArray::left((UByteArray *)((long)&body.d.field_2 + 8),(UByteArray *)&is.field_0x150,
                           uVar10);
          iVar9 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
          iVar11 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
          UByteArray::mid((UByteArray *)&name_1.super_tagbstring.data,(UByteArray *)&is.field_0x150,
                          iVar9,uVar7 - iVar11);
          Bstrlib::CBString::CBString
                    ((CBString *)&info_1.super_tagbstring.data,"Insyde H2O FlashDeviceMap");
          uVar8 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
          uVar12 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
          UByteArray::size((UByteArray *)&name_1.super_tagbstring.data);
          UByteArray::size((UByteArray *)&name_1.super_tagbstring.data);
          insyde_fdm_t::data_offset((insyde_fdm_t *)local_968);
          insyde_fdm_t::entry_size((insyde_fdm_t *)local_968);
          insyde_fdm_t::entry_size((insyde_fdm_t *)local_968);
          insyde_fdm_t::entry_format((insyde_fdm_t *)local_968);
          insyde_fdm_t::revision((insyde_fdm_t *)local_968);
          insyde_fdm_t::num_extensions((insyde_fdm_t *)local_968);
          insyde_fdm_t::fd_base_address((insyde_fdm_t *)local_968);
          insyde_fdm_t::checksum((insyde_fdm_t *)local_968);
          usprintf((CBString *)((long)&tempHeader.d.field_2 + 8),
                   "Signature: HFDM\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nData offset: %Xh\nEntry size: %Xh (%u)\nEntry format: %02Xh\nRevision: %02Xh\nExtension count: %u\nFlash descriptor base address: %08Xh\nChecksum: %02Xh"
                   ,(ulong)uVar7,(ulong)uVar7,(ulong)uVar8,(ulong)uVar12);
          UByteArray::mid((UByteArray *)&tempFdmHeader,(UByteArray *)local_68,itemAltSize,0x1c);
          buffer = (UINT8 *)UByteArray::data((UByteArray *)&tempFdmHeader);
          buffer[0x13] = '\0';
          pUStack_a08 = buffer;
          UVar6 = UByteArray::size((UByteArray *)&tempFdmHeader);
          bVar3 = calculateChecksum8(buffer,UVar6);
          local_a09 = bVar3;
          bVar4 = insyde_fdm_t::checksum((insyde_fdm_t *)local_968);
          if (bVar3 == bVar4) {
            Bstrlib::CBString::CBString(&local_a28,", valid");
            Bstrlib::CBString::operator+=((CBString *)((long)&tempHeader.d.field_2 + 8),&local_a28);
            Bstrlib::CBString::~CBString(&local_a28);
          }
          else {
            usprintf(&local_a40,", invalid, should be %02Xh",(ulong)local_a09);
            Bstrlib::CBString::operator+=((CBString *)((long)&tempHeader.d.field_2 + 8),&local_a40);
            Bstrlib::CBString::~CBString(&local_a40);
          }
          UByteArray::~UByteArray((UByteArray *)&tempFdmHeader);
          bVar1 = insyde_fdm_t::_is_null_board_ids((insyde_fdm_t *)local_968);
          if (!bVar1) {
            pfVar18 = insyde_fdm_t::board_ids((insyde_fdm_t *)local_968);
            uVar10 = insyde_fdm_t::fdm_board_ids_t::region_index(pfVar18);
            pfVar18 = insyde_fdm_t::board_ids((insyde_fdm_t *)local_968);
            uVar13 = insyde_fdm_t::fdm_board_ids_t::num_board_ids(pfVar18);
            usprintf((CBString *)local_a58,"\nRegion index: %Xh\nBoardId Count: %u",(ulong)uVar10,
                     (ulong)uVar13);
            Bstrlib::CBString::operator+=
                      ((CBString *)((long)&tempHeader.d.field_2 + 8),(CBString *)local_a58);
            Bstrlib::CBString::~CBString((CBString *)local_a58);
            __range7._4_4_ = 0;
            pfVar18 = insyde_fdm_t::board_ids((insyde_fdm_t *)local_968);
            this_00 = insyde_fdm_t::fdm_board_ids_t::board_ids(pfVar18);
            __end7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
            boardId = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end7,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                               *)&boardId), bVar1) {
              puVar19 = __gnu_cxx::
                        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator*(&__end7);
              uVar24 = (ulong)__range7._4_4_;
              __range7._4_4_ = __range7._4_4_ + 1;
              usprintf((CBString *)&headerIndex.m,"\nBoardId #%u: %lX\n",uVar24,*puVar19);
              Bstrlib::CBString::operator+=
                        ((CBString *)((long)&tempHeader.d.field_2 + 8),(CBString *)&headerIndex.m);
              Bstrlib::CBString::~CBString((CBString *)&headerIndex.m);
              __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator++(&__end7);
            }
          }
          pTVar23 = this->model;
          UVar6 = local_6c + itemAltSize;
          Bstrlib::CBString::CBString(&local_ac8);
          UByteArray::UByteArray((UByteArray *)local_ae8);
          TreeModel::addItem((UModelIndex *)local_ab0,pTVar23,UVar6,'L','\0',
                             (CBString *)&info_1.super_tagbstring.data,&local_ac8,
                             (CBString *)((long)&tempHeader.d.field_2 + 8),
                             (UByteArray *)((long)&body.d.field_2 + 8),
                             (UByteArray *)&name_1.super_tagbstring.data,(UByteArray *)local_ae8,
                             Fixed,(UModelIndex *)data.d.field_2._8_8_,'\0');
          UByteArray::~UByteArray((UByteArray *)local_ae8);
          Bstrlib::CBString::~CBString(&local_ac8);
          __range6._4_4_ = insyde_fdm_t::data_offset((insyde_fdm_t *)local_968);
          bVar1 = false;
          this_01 = insyde_fdm_t::entries((insyde_fdm_t *)local_968);
          this_02 = insyde_fdm_t::fdm_entries_t::entries(this_01);
          __end6 = std::
                   vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>
                   ::begin(this_02);
          entry = (unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                   *)std::
                     vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>
                     ::end(this_02);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_*,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_>
                                             *)&entry), bVar5) {
            guid.Data4 = (UINT8  [8])
                         __gnu_cxx::
                         __normal_iterator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_*,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_>
                         ::operator*(&__end6);
            pfVar20 = std::
                      unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                      ::operator->((unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                                    *)guid.Data4);
            insyde_fdm_t::fdm_entry_t::guid_abi_cxx11_(&local_b40,pfVar20);
            v = (EFI_GUID_ *)std::__cxx11::string::c_str();
            EVar25 = readUnaligned<EFI_GUID_>(v);
            guid._0_8_ = EVar25.Data4;
            local_b20 = EVar25._0_8_;
            std::__cxx11::string::~string((string *)&local_b40);
            insydeFlashDeviceMapEntryTypeGuidToUString
                      ((CBString *)&text.super_tagbstring.data,(EFI_GUID *)local_b20);
            Bstrlib::CBString::operator=
                      ((CBString *)&info_1.super_tagbstring.data,
                       (CBString *)&text.super_tagbstring.data);
            Bstrlib::CBString::~CBString((CBString *)&text.super_tagbstring.data);
            Bstrlib::CBString::CBString((CBString *)local_b70);
            UByteArray::mid(&local_b90,(UByteArray *)local_68,itemAltSize + __range6._4_4_,0x34);
            UByteArray::operator=((UByteArray *)((long)&body.d.field_2 + 8),&local_b90);
            UByteArray::~UByteArray(&local_b90);
            iVar14 = itemAltSize + __range6._4_4_;
            iVar9 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
            uVar10 = insyde_fdm_t::entry_size((insyde_fdm_t *)local_968);
            iVar11 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
            UByteArray::mid((UByteArray *)local_bb0,(UByteArray *)local_68,iVar14 + iVar9,
                            uVar10 - iVar11);
            UByteArray::operator=
                      ((UByteArray *)&name_1.super_tagbstring.data,(UByteArray *)local_bb0);
            UByteArray::~UByteArray((UByteArray *)local_bb0);
            iVar9 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
            iVar11 = UByteArray::size((UByteArray *)&name_1.super_tagbstring.data);
            local_bb4 = iVar9 + iVar11;
            Bstrlib::CBString::CBString(&local_c00,"Region type: ");
            guidToUString(&local_c18,(EFI_GUID *)local_b20,false);
            Bstrlib::CBString::operator+(&local_be8,&local_c00,&local_c18);
            Bstrlib::CBString::operator+(&local_bd0,&local_be8,"\n");
            Bstrlib::CBString::operator=((CBString *)((long)&tempHeader.d.field_2 + 8),&local_bd0);
            Bstrlib::CBString::~CBString(&local_bd0);
            Bstrlib::CBString::~CBString(&local_be8);
            Bstrlib::CBString::~CBString(&local_c18);
            Bstrlib::CBString::~CBString(&local_c00);
            Bstrlib::CBString::CBString((CBString *)local_c30,"Region id: ");
            Bstrlib::CBString::operator+=
                      ((CBString *)((long)&tempHeader.d.field_2 + 8),(CBString *)local_c30);
            Bstrlib::CBString::~CBString((CBString *)local_c30);
            for (local_c31 = 0; uVar7 = local_bb4, local_c31 < 0x10; local_c31 = local_c31 + 1) {
              pfVar20 = std::
                        unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                        ::operator->((unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                                      *)guid.Data4);
              insyde_fdm_t::fdm_entry_t::region_id_abi_cxx11_(&local_c70,pfVar20);
              lVar21 = std::__cxx11::string::c_str();
              usprintf(&local_c50,"%02X",(ulong)*(byte *)(lVar21 + (ulong)local_c31));
              Bstrlib::CBString::operator+=
                        ((CBString *)((long)&tempHeader.d.field_2 + 8),&local_c50);
              Bstrlib::CBString::~CBString(&local_c50);
              std::__cxx11::string::~string((string *)&local_c70);
            }
            uVar8 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
            uVar12 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
            UByteArray::size((UByteArray *)&name_1.super_tagbstring.data);
            UByteArray::size((UByteArray *)&name_1.super_tagbstring.data);
            pfVar20 = std::
                      unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                      ::operator->((unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                                    *)guid.Data4);
            insyde_fdm_t::fdm_entry_t::region_base(pfVar20);
            pfVar20 = std::
                      unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                      ::operator->((unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                                    *)guid.Data4);
            insyde_fdm_t::fdm_entry_t::region_size(pfVar20);
            pfVar20 = std::
                      unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                      ::operator->((unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                                    *)guid.Data4);
            insyde_fdm_t::fdm_entry_t::attributes(pfVar20);
            usprintf(&local_c88,
                     "\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nRegion address: %08Xh\nRegion size: %08Xh\nAttributes: %08Xh"
                     ,(ulong)uVar7,(ulong)uVar7,(ulong)uVar8,(ulong)uVar12);
            Bstrlib::CBString::operator+=((CBString *)((long)&tempHeader.d.field_2 + 8),&local_c88);
            Bstrlib::CBString::~CBString(&local_c88);
            pfVar20 = std::
                      unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                      ::operator->((unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                                    *)guid.Data4);
            uVar10 = insyde_fdm_t::fdm_entry_t::attributes(pfVar20);
            if ((uVar10 & 1) == 0) {
              if (!bVar1) {
                UVar6 = TreeModel::base(this->model,(UModelIndex *)local_ab0);
                usprintf((CBString *)((long)&range.Hash.d.field_2 + 8),
                         "Insyde Flash Device Map found at base %08Xh\nProtected ranges:\n",
                         (ulong)UVar6);
                Bstrlib::CBString::operator+=
                          (&this->securityInfo,(CBString *)((long)&range.Hash.d.field_2 + 8));
                Bstrlib::CBString::~CBString((CBString *)((long)&range.Hash.d.field_2 + 8));
                bVar1 = true;
              }
              local_cd0._0_4_ = 0;
              local_cd0._4_4_ = 0;
              range.Offset._0_2_ = 0;
              range.Offset._2_1_ = 0;
              UByteArray::UByteArray((UByteArray *)&range.AlgorithmId);
              pfVar20 = std::
                        unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                        ::operator->((unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                                      *)guid.Data4);
              local_cd0._0_4_ = insyde_fdm_t::fdm_entry_t::region_base(pfVar20);
              pfVar20 = std::
                        unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                        ::operator->((unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>
                                      *)guid.Data4);
              uVar22 = insyde_fdm_t::fdm_entry_t::region_size(pfVar20);
              local_cd0._4_4_ = (undefined4)uVar22;
              range.Offset._0_2_ = 0xb;
              range.Offset._2_1_ = 9;
              UByteArray::operator=
                        ((UByteArray *)&range.AlgorithmId,
                         (UByteArray *)&name_1.super_tagbstring.data);
              std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                        (&this->protectedRanges,(value_type *)local_cd0);
              usprintf(&local_d18,"Address: %08Xh Size: %Xh\nHash: ",(ulong)(uint)local_cd0._0_4_,
                       (ulong)(uint)local_cd0._4_4_);
              UByteArray::toHex(&local_d50,(UByteArray *)&name_1.super_tagbstring.data);
              pcVar17 = UByteArray::constData(&local_d50);
              Bstrlib::CBString::CBString(&local_d30,pcVar17);
              Bstrlib::CBString::operator+(&local_d00,&local_d18,&local_d30);
              Bstrlib::CBString::operator+(&local_ce8,&local_d00,"\n");
              Bstrlib::CBString::operator+=(&this->securityInfo,&local_ce8);
              Bstrlib::CBString::~CBString(&local_ce8);
              Bstrlib::CBString::~CBString(&local_d00);
              Bstrlib::CBString::~CBString(&local_d30);
              UByteArray::~UByteArray(&local_d50);
              Bstrlib::CBString::~CBString(&local_d18);
              PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_cd0);
            }
            pTVar23 = this->model;
            UByteArray::UByteArray(&local_d70);
            TreeModel::addItem((UModelIndex *)((long)&padding_3.d.field_2 + 8),pTVar23,
                               __range6._4_4_,'T','\0',(CBString *)&info_1.super_tagbstring.data,
                               (CBString *)local_b70,(CBString *)((long)&tempHeader.d.field_2 + 8),
                               (UByteArray *)((long)&body.d.field_2 + 8),
                               (UByteArray *)&name_1.super_tagbstring.data,&local_d70,Fixed,
                               (UModelIndex *)local_ab0,'\0');
            UByteArray::~UByteArray(&local_d70);
            __range6._4_4_ = local_bb4 + __range6._4_4_;
            Bstrlib::CBString::~CBString((CBString *)local_b70);
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_*,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_>
            ::operator++(&__end6);
          }
          if (bVar1) {
            Bstrlib::CBString::operator+=(&this->securityInfo,"\n");
          }
          Bstrlib::CBString::~CBString((CBString *)((long)&tempHeader.d.field_2 + 8));
          Bstrlib::CBString::~CBString((CBString *)&info_1.super_tagbstring.data);
          UByteArray::~UByteArray((UByteArray *)&name_1.super_tagbstring.data);
          UByteArray::~UByteArray((UByteArray *)((long)&body.d.field_2 + 8));
          insyde_fdm_t::~insyde_fdm_t((insyde_fdm_t *)local_968);
          kaitai::kstream::~kstream((kstream *)&parsed.m__io__raw_entries);
          umemstream::~umemstream((umemstream *)&ks.m_bits);
          UByteArray::~UByteArray((UByteArray *)&is.field_0x150);
        }
        prevItemAltSize = itemAltSize;
        local_e4 = paddingOffset;
        prevItemSize._3_1_ = itemSize._3_1_;
        name.super_tagbstring.data =
             (uchar *)findNextRawAreaItem(this,(UModelIndex *)data.d.field_2._8_8_,
                                          itemAltSize + paddingOffset,(UINT8 *)((long)&itemSize + 3)
                                          ,&itemAltSize,&paddingOffset,&paddingSize);
      }
      itemAltSize = prevItemAltSize + local_e4;
      uVar7 = UByteArray::size((UByteArray *)local_68);
      if (itemAltSize < uVar7) {
        UByteArray::mid((UByteArray *)local_da8,(UByteArray *)local_68,itemAltSize,-1);
        Bstrlib::CBString::CBString(&local_dc0,"Padding");
        Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_dc0);
        Bstrlib::CBString::~CBString(&local_dc0);
        uVar7 = UByteArray::size((UByteArray *)local_da8);
        uVar8 = UByteArray::size((UByteArray *)local_da8);
        usprintf(&local_dd8,"Full size: %Xh (%u)",(ulong)uVar7,(ulong)uVar8);
        Bstrlib::CBString::operator=((CBString *)&prevItemOffset,&local_dd8);
        Bstrlib::CBString::~CBString(&local_dd8);
        pTVar23 = this->model;
        UVar6 = local_6c + itemAltSize;
        UVar2 = getPaddingType((UByteArray *)local_da8);
        Bstrlib::CBString::CBString(&local_df0);
        UByteArray::UByteArray(&local_e10);
        UByteArray::UByteArray(&local_e30);
        TreeModel::addItem((UModelIndex *)&stack0xfffffffffffff1b8,pTVar23,UVar6,'@',UVar2,
                           (CBString *)&info.super_tagbstring.data,&local_df0,
                           (CBString *)&prevItemOffset,&local_e10,(UByteArray *)local_da8,&local_e30
                           ,Fixed,(UModelIndex *)data.d.field_2._8_8_,'\0');
        UByteArray::~UByteArray(&local_e30);
        UByteArray::~UByteArray(&local_e10);
        Bstrlib::CBString::~CBString(&local_df0);
        UByteArray::~UByteArray((UByteArray *)local_da8);
      }
      for (current.m._4_4_ = 0; iVar14 = current.m._4_4_,
          iVar15 = TreeModel::rowCount(this->model,(UModelIndex *)data.d.field_2._8_8_),
          iVar14 < iVar15; current.m._4_4_ = current.m._4_4_ + 1) {
        pTVar23 = UModelIndex::model((UModelIndex *)data.d.field_2._8_8_);
        TreeModel::index((TreeModel *)local_e68,(char *)pTVar23,current.m._4_4_);
        UVar2 = TreeModel::type(this->model,(UModelIndex *)local_e68);
        switch(UVar2) {
        case '@':
          break;
        case 'A':
          parseVolumeBody(this,(UModelIndex *)local_e68);
          break;
        default:
          this_local = (FfsParser *)0x9;
          goto LAB_00148dc4;
        case 'L':
          break;
        case 'U':
          break;
        case '\\':
          break;
        case '^':
        }
      }
      this_local = (FfsParser *)0x0;
    }
    else {
      this_local = (FfsParser *)0x0;
    }
LAB_00148dc4:
    padding.d.field_2._12_4_ = 1;
    Bstrlib::CBString::~CBString((CBString *)&prevItemOffset);
    Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
    UByteArray::~UByteArray((UByteArray *)local_68);
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseRawArea(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Get item data
    UByteArray data = model->body(index);
    UINT32 headerSize = (UINT32)model->header(index).size();
    
    USTATUS result;
    UString name;
    UString info;
    
    // Search for the first item
    UINT8  prevItemType = 0;
    UINT32 prevItemOffset = 0;
    UINT32 prevItemSize = 0;
    UINT32 prevItemAltSize = 0;
    
    result = findNextRawAreaItem(index, 0, prevItemType, prevItemOffset, prevItemSize, prevItemAltSize);
    if (result) {
        // No need to parse further
        return U_SUCCESS;
    }
    
    // Set base of protected regions to be the first volume
    if (model->type(index) == Types::Region
        && model->subtype(index) == Subtypes::BiosRegion) {
        protectedRegionsBase = (UINT64)model->base(index) + prevItemOffset;
    }
    
    // First item is not at the beginning of this raw area
    if (prevItemOffset > 0) {
        // Get info
        UByteArray padding = data.left(prevItemOffset);
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(headerSize, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
    }
    
    // Search for and parse all items
    UINT8  itemType = prevItemType;
    UINT32 itemOffset = prevItemOffset;
    UINT32 itemSize = prevItemSize;
    UINT32 itemAltSize = prevItemAltSize;
    
    while (!result) {
        // Padding between items
        if (itemOffset > prevItemOffset + prevItemSize) {
            UINT32 paddingOffset = prevItemOffset + prevItemSize;
            UINT32 paddingSize = itemOffset - paddingOffset;
            UByteArray padding = data.mid(paddingOffset, paddingSize);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            model->addItem(headerSize + paddingOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
        }
        
        // Check that item is fully present in input
        if (itemSize > (UINT32)data.size() || itemOffset + itemSize > (UINT32)data.size()) {
            // Mark the rest as padding and finish parsing
            UByteArray padding = data.mid(itemOffset);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            UModelIndex paddingIndex = model->addItem(headerSize + itemOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
            msg(usprintf("%s: one of objects inside overlaps the end of data", __FUNCTION__), paddingIndex);
            
            // Update variables
            prevItemOffset = itemOffset;
            prevItemSize = (UINT32)padding.size();
            break;
        }
        
        // Parse current volume header
        if (itemType == Types::Volume) {
            UModelIndex volumeIndex;
            UByteArray volume = data.mid(itemOffset, itemSize);
            result = parseVolumeHeader(volume, headerSize + itemOffset, index, volumeIndex);
            if (result) {
                msg(usprintf("%s: volume header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            } else {
                // Show messages
                if (itemSize != itemAltSize)
                    msg(usprintf("%s: volume size stored in header %Xh differs from calculated using block map %Xh", __FUNCTION__,
                                 itemSize, itemAltSize),
                        volumeIndex);
            }
        }
        else if (itemType == Types::Microcode) {
            UModelIndex microcodeIndex;
            UByteArray microcode = data.mid(itemOffset, itemSize);
            result = parseIntelMicrocodeHeader(microcode, headerSize + itemOffset, index, microcodeIndex);
            if (result) {
                msg(usprintf("%s: microcode header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            }
        }
        else if (itemType == Types::BpdtStore) {
            UByteArray bpdtStore = data.mid(itemOffset, itemSize);
            
            // Get info
            name = UString("BPDT region");
            info = usprintf("Full size: %Xh (%u)", (UINT32)bpdtStore.size(), (UINT32)bpdtStore.size());
            
            // Add tree item
            UModelIndex bpdtIndex = model->addItem(headerSize + itemOffset, Types::BpdtStore, 0, name, UString(), info, UByteArray(), bpdtStore, UByteArray(), Fixed, index);
            
            // Parse BPDT region
            UModelIndex bpdtPtIndex;
            result = parseBpdtRegion(bpdtStore, 0, 0, bpdtIndex, bpdtPtIndex);
            if (result) {
                msg(usprintf("%s: BPDT store parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            }
        }
        else if (itemType == Types::InsydeFlashDeviceMapStore) {
            try {
                UByteArray fdm = data.mid(itemOffset, itemSize);
                umemstream is(fdm.constData(), fdm.size());
                kaitai::kstream ks(&is);
                insyde_fdm_t parsed(&ks);
                UINT32 storeSize = (UINT32)fdm.size();
                
                // Construct header and body
                UByteArray header = fdm.left(parsed.data_offset());
                UByteArray body = fdm.mid(header.size(), storeSize - header.size());
                
                // Add info
                UString name = UString("Insyde H2O FlashDeviceMap");
                UString info = usprintf("Signature: HFDM\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nData offset: %Xh\nEntry size: %Xh (%u)\nEntry format: %02Xh\nRevision: %02Xh\nExtension count: %u\nFlash descriptor base address: %08Xh\nChecksum: %02Xh",
                                        storeSize, storeSize,
                                        (UINT32)header.size(), (UINT32)header.size(),
                                        (UINT32)body.size(), (UINT32)body.size(),
                                        parsed.data_offset(),
                                        parsed.entry_size(), parsed.entry_size(),
                                        parsed.entry_format(),
                                        parsed.revision(),
                                        parsed.num_extensions(),
                                        (UINT32)parsed.fd_base_address(),
                                        parsed.checksum());
                
                // Check header checksum
                {
                    UByteArray tempHeader = data.mid(itemOffset, sizeof(INSYDE_FLASH_DEVICE_MAP_HEADER));
                    INSYDE_FLASH_DEVICE_MAP_HEADER* tempFdmHeader = (INSYDE_FLASH_DEVICE_MAP_HEADER*)tempHeader.data();
                    tempFdmHeader->Checksum = 0;
                    UINT8 calculated = calculateChecksum8((const UINT8*)tempFdmHeader, (UINT32)tempHeader.size());
                    if (calculated == parsed.checksum()) {
                        info += UString(", valid");
                    }
                    else {
                        info += usprintf(", invalid, should be %02Xh", calculated);
                    }
                }
                
                // Add board IDs
                if (!parsed._is_null_board_ids()) {
                    info += usprintf("\nRegion index: %Xh\nBoardId Count: %u",
                                     parsed.board_ids()->region_index(),
                                     parsed.board_ids()->num_board_ids());
                    UINT32 i = 0;
                    for (const auto & boardId : *parsed.board_ids()->board_ids()) {
                        info += usprintf("\nBoardId #%u: %" PRIX64 "\n", i++, boardId);
                    }
                }
                
                // Add header tree item
                UModelIndex headerIndex = model->addItem(headerSize + itemOffset, Types::InsydeFlashDeviceMapStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, index);
                
                // Add entries
                UINT32 entryOffset = parsed.data_offset();
                bool protectedRangeFound = false;
                for (const auto & entry : *parsed.entries()->entries()) {
                    const EFI_GUID guid = readUnaligned((const EFI_GUID*)entry->guid().c_str());
                    name = insydeFlashDeviceMapEntryTypeGuidToUString(guid);
                    UString text;
                    header = data.mid(itemOffset + entryOffset, sizeof(INSYDE_FLASH_DEVICE_MAP_ENTRY));
                    body = data.mid(itemOffset + entryOffset + header.size(), parsed.entry_size() - header.size());
                    
                    // Add info
                    UINT32 entrySize = (UINT32)header.size() + (UINT32)body.size();
                    info = UString("Region type: ") + guidToUString(guid, false) + "\n";
                    info += UString("Region id: ");
                    for (UINT8 i = 0; i < 16; i++) {
                        info += usprintf("%02X", *(const UINT8*)(entry->region_id().c_str() + i));
                    }
                    info += usprintf("\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nRegion address: %08Xh\nRegion size: %08Xh\nAttributes: %08Xh",
                                     entrySize, entrySize,
                                     (UINT32)header.size(), (UINT32)header.size(),
                                     (UINT32)body.size(), (UINT32)body.size(),
                                     (UINT32)entry->region_base(),
                                     (UINT32)entry->region_size(),
                                     entry->attributes());
                    
                    if ((entry->attributes() & INSYDE_FLASH_DEVICE_MAP_ENTRY_ATTRIBUTE_MODIFIABLE) == 0) {
                        if (!protectedRangeFound) {
                            securityInfo += usprintf("Insyde Flash Device Map found at base %08Xh\nProtected ranges:\n", model->base(headerIndex));
                            protectedRangeFound = true;
                        }
                        
                        // TODO: make sure that the only hash possible here is SHA256
                        
                        // Add this region to the list of Insyde protected regions
                        PROTECTED_RANGE range = {};
                        range.Offset = (UINT32)entry->region_base();
                        range.Size = (UINT32)entry->region_size();
                        range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                        range.Type = PROTECTED_RANGE_VENDOR_HASH_INSYDE;
                        range.Hash = body;
                        protectedRanges.push_back(range);
                        
                        securityInfo += usprintf("Address: %08Xh Size: %Xh\nHash: ", range.Offset, range.Size) + UString(body.toHex().constData()) + "\n";
                    }
                    
                    // Add tree item
                    model->addItem(entryOffset, Types::InsydeFlashDeviceMapEntry, 0, name, text, info, header, body, UByteArray(), Fixed, headerIndex);
                    
                    entryOffset += entrySize;
                }
                
                if (protectedRangeFound) {
                    securityInfo += "\n";
                }
            }
            catch (...) {
                // Parsing failed
            }
        }
        else {
            return U_UNKNOWN_ITEM_TYPE;
        }
        
        // Go to next item
        prevItemOffset = itemOffset;
        prevItemSize = itemSize;
        prevItemType = itemType;
        result = findNextRawAreaItem(index, itemOffset + prevItemSize, itemType, itemOffset, itemSize, itemAltSize);
        
        // Silence value not used after assignment warning
        (void)prevItemType;
    }
    
    // Padding at the end of RAW area
    itemOffset = prevItemOffset + prevItemSize;
    if ((UINT32)data.size() > itemOffset) {
        UByteArray padding = data.mid(itemOffset);
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(headerSize + itemOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
    }
    
    // Parse bodies
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::Volume:
                parseVolumeBody(current);
                break;
            case Types::Microcode:
                // Parsing already done
                break;
            case Types::BpdtStore:
                // Parsing already done
                break;
            case Types::BpdtPartition:
                // Parsing already done
                break;
            case Types::InsydeFlashDeviceMapStore:
                // Parsing already done
                break;
            case Types::Padding:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}